

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double fpser(double *a,double *b,double *x,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = *a;
  dVar2 = *eps;
  if (dVar6 <= dVar2 * 0.001) {
    dVar3 = 1.0;
  }
  else {
    fpser::fpser = 0.0;
    dVar2 = log(*x);
    fpser::t = dVar6 * dVar2;
    dVar3 = exparg(&fpser::K1);
    if (dVar6 * dVar2 < dVar3) {
      return fpser::fpser;
    }
    dVar3 = exp(fpser::t);
    dVar6 = *a;
    dVar2 = *eps;
  }
  dVar4 = dVar6 + 1.0;
  dVar1 = *x;
  dVar5 = dVar1 / dVar4;
  fpser::t = dVar1;
  do {
    dVar4 = dVar4 + 1.0;
    fpser::t = fpser::t * dVar1;
    dVar5 = dVar5 + fpser::t / dVar4;
  } while (dVar2 / dVar6 < ABS(fpser::t / dVar4));
  fpser::fpser = (*b / dVar6) * dVar3 * (dVar6 * dVar5 + 1.0);
  return fpser::fpser;
}

Assistant:

double fpser(double *a,double *b,double *x,double *eps)
/*
-----------------------------------------------------------------------

                 EVALUATION OF I (A,B)
                                X

          FOR B .LT. MIN(EPS,EPS*A) AND X .LE. 0.5.

-----------------------------------------------------------------------

                  SET  FPSER = X**A
*/
{
static int K1 = 1;
static double fpser,an,c,s,t,tol;
/*
     ..
     .. Executable Statements ..
*/
    fpser = 1.0e0;
    if(*a <= 1.e-3**eps) goto S10;
    fpser = 0.0e0;
    t = *a*log(*x);
    if(t < exparg(&K1)) return fpser;
    fpser = exp(t);
S10:
/*
                NOTE THAT 1/B(A,B) = B
*/
    fpser = *b/ *a*fpser;
    tol = *eps/ *a;
    an = *a+1.0e0;
    t = *x;
    s = t/an;
S20:
    an += 1.0e0;
    t = *x*t;
    c = t/an;
    s += c;
    if(fabs(c) > tol) goto S20;
    fpser *= (1.0e0+*a*s);
    return fpser;
}